

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

double ApproxDist2Ortho(ON_Xform *L)

{
  double *pdVar1;
  double dVar2;
  ON_Interval OVar3;
  double local_28;
  double dist;
  ON_Interval Spec;
  ON_Xform *L_local;
  
  Spec.m_t[1] = (double)L;
  OVar3 = ApproxSpectrumLTL(L);
  dist = OVar3.m_t[0];
  Spec.m_t[0] = OVar3.m_t[1];
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,0);
  if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
    pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,0);
    *pdVar1 = 0.0;
  }
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,0);
  dVar2 = sqrt(*pdVar1);
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,0);
  *pdVar1 = dVar2 - 1.0;
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,1);
  dVar2 = sqrt(*pdVar1);
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,1);
  *pdVar1 = dVar2 - 1.0;
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,0);
  local_28 = ABS(*pdVar1);
  pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,1);
  if (local_28 < ABS(*pdVar1)) {
    pdVar1 = ON_Interval::operator[]((ON_Interval *)&dist,1);
    local_28 = ABS(*pdVar1);
  }
  return local_28;
}

Assistant:

static double ApproxDist2Ortho(const ON_Xform& L)
{
	// L.IsLinear() is a precondition

	ON_Interval Spec = ApproxSpectrumLTL(L);
	if (Spec[0] < 0) Spec[0] = 0.0;
	Spec[0] = sqrt(Spec[0]) - 1.0;
	Spec[1] = sqrt(Spec[1]) - 1.0;		// contains Spectrum of (L^T L)^(-1/2) - I
	double dist = fabs(Spec[0]);
	if (dist < fabs(Spec[1]))
		dist = fabs(Spec[1]);

	return dist;
}